

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

QRgbaFloat32 *
fetchTransformedFP<(TextureBlendType)3>
          (QRgbaFloat32 *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  uint uVar1;
  long in_RDX;
  QRgbaFloat32 *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  QPixelLayout *layout;
  quint64 buffer64 [2048];
  uint buffer32 [2048];
  undefined8 in_stack_ffffffffffff9fb8;
  QPixelLayout *buffer_00;
  quint64 local_6008 [14];
  int in_stack_ffffffffffffa06c;
  int in_stack_ffffffffffffa070;
  int in_stack_ffffffffffffa074;
  undefined4 in_stack_ffffffffffffa078;
  int in_stack_ffffffffffffa07c;
  int in_stack_ffffffffffffa080;
  int in_stack_ffffffffffffa084;
  QSpanData *in_stack_ffffffffffffa088;
  uint *in_stack_ffffffffffffa090;
  uint local_2008 [2048];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(uint *)(in_RDX + 0xd0);
  buffer_00 = qPixelLayouts + uVar1;
  if ((int)qPixelLayouts[uVar1].bpp < 7) {
    if (qPixelLayouts[uVar1].bpp == BPP32) {
      fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)6,unsigned_int>
                ((uint *)CONCAT44(in_stack_ffffffffffffa084,in_stack_ffffffffffffa080),
                 (QSpanData *)CONCAT44(in_stack_ffffffffffffa07c,in_stack_ffffffffffffa078),
                 in_stack_ffffffffffffa074,in_stack_ffffffffffffa070,in_stack_ffffffffffffa06c);
    }
    else {
      fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)0,unsigned_int>
                (in_stack_ffffffffffffa090,in_stack_ffffffffffffa088,in_stack_ffffffffffffa084,
                 in_stack_ffffffffffffa080,in_stack_ffffffffffffa07c);
    }
    (*qConvertToRGBA32F[*(uint *)(in_RDX + 0xd0)])
              (in_RDI,local_2008,in_R9D,*(QList<unsigned_int> **)(in_RDX + 0xd8),(QDitherInfo *)0x0)
    ;
  }
  else if ((int)qPixelLayouts[uVar1].bpp < 9) {
    fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)7,unsigned_long_long>
              ((unsigned_long_long *)CONCAT44(in_stack_ffffffffffffa084,in_stack_ffffffffffffa080),
               (QSpanData *)CONCAT44(in_stack_ffffffffffffa07c,in_stack_ffffffffffffa078),
               in_stack_ffffffffffffa074,in_stack_ffffffffffffa070,in_stack_ffffffffffffa06c);
    (*convert64ToRGBA32F[*(uint *)(in_RDX + 0xd0)])(in_RDI,local_6008,in_R9D);
  }
  else {
    fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)9,QRgbaFloat<float>>
              ((QRgbaFloat<float> *)CONCAT44(in_stack_ffffffffffffa084,in_stack_ffffffffffffa080),
               (QSpanData *)CONCAT44(in_stack_ffffffffffffa07c,in_stack_ffffffffffffa078),
               in_stack_ffffffffffffa074,in_stack_ffffffffffffa070,in_stack_ffffffffffffa06c);
    if (*(int *)(in_RDX + 0xd0) == 0x22) {
      convertRGBA32FToRGBA32FPM
                ((QRgbaFloat32 *)buffer_00,(int)((ulong)in_stack_ffffffffffff9fb8 >> 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchTransformedFP(QRgbaFloat32 *buffer, const Operator *, const QSpanData *data,
                                                      int y, int x, int length)
{
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    if (layout->bpp < QPixelLayout::BPP64) {
        Q_DECL_UNINITIALIZED uint buffer32[BufferSize];
        Q_ASSERT(length <= BufferSize);
        if (layout->bpp == QPixelLayout::BPP32)
            fetchTransformed_fetcher<blendType, QPixelLayout::BPP32, uint>(buffer32, data, y, x, length);
        else
            fetchTransformed_fetcher<blendType, QPixelLayout::BPPNone, uint>(buffer32, data, y, x, length);
        qConvertToRGBA32F[data->texture.format](buffer, buffer32, length, data->texture.colorTable, nullptr);
    } else if (layout->bpp < QPixelLayout::BPP32FPx4) {
        Q_DECL_UNINITIALIZED quint64 buffer64[BufferSize];
        fetchTransformed_fetcher<blendType, QPixelLayout::BPP64, quint64>(buffer64, data, y, x, length);
        convert64ToRGBA32F[data->texture.format](buffer, buffer64, length);
    } else {
        fetchTransformed_fetcher<blendType, QPixelLayout::BPP32FPx4, QRgbaFloat32>(buffer, data, y, x, length);
        if (data->texture.format == QImage::Format_RGBA32FPx4)
            convertRGBA32FToRGBA32FPM(buffer, length);
        return buffer;
    }
    return buffer;
}